

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::unordered_multiset<float,std::hash<float>,std::equal_to<float>,std::allocator<float>>>
               (unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
                *value,ostream *os)

{
  ostream *os_local;
  unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
  *value_local;
  
  ContainerPrinter::
  PrintValue<std::unordered_multiset<float,std::hash<float>,std::equal_to<float>,std::allocator<float>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}